

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marschner_lobb.hpp
# Opt level: O1

double __thiscall sisl::test::marschner_lobb::operator()(marschner_lobb *this,double d0,...)

{
  char in_AL;
  double *pdVar1;
  undefined8 *puVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  double extraout_XMM0_Qa;
  undefined4 in_XMM1_Da;
  double in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  vector V;
  va_list vl;
  double *local_e8;
  undefined8 uStack_e0;
  undefined4 local_d8;
  undefined4 uStack_d4;
  Index *local_d0;
  undefined1 *local_c8;
  double local_c0;
  undefined1 local_b8 [8];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined4 local_78;
  undefined4 uStack_74;
  double local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  if (in_AL != '\0') {
    local_78 = in_XMM1_Da;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  local_e8 = (double *)0x0;
  uStack_e0 = 0;
  local_c0 = d0;
  local_b0 = in_RSI;
  local_a8 = in_RDX;
  local_a0 = in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  free((void *)0x0);
  pdVar1 = (double *)malloc(0x18);
  if (((ulong)pdVar1 & 0xf) != 0) {
    __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                  "void *Eigen::internal::aligned_malloc(std::size_t)");
  }
  if (pdVar1 == (double *)0x0) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = std::ios::widen;
    __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  uStack_e0 = 3;
  *pdVar1 = local_c0;
  local_c8 = local_b8;
  local_d0 = &V.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  local_d8 = 8;
  pdVar1[1] = (double)CONCAT44(uStack_74,local_78);
  uStack_d4 = 0x60;
  pdVar1[2] = local_68;
  local_e8 = pdVar1;
  (*(this->super_function)._vptr_function[3])(this,&local_e8);
  local_c0 = extraout_XMM0_Qa;
  free(local_e8);
  return local_c0;
}

Assistant:

virtual const double operator()(double d0, ...) const {
                va_list vl;
                vector V(3);
                V[0] = d0;

                va_start(vl, d0);
                V[1] = va_arg(vl, double);
                V[2] = va_arg(vl, double);
                va_end(vl);

                return (*this)(V);
            }